

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O1

MatrixXd * __thiscall CppMLNN::softmax(MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *z)

{
  char *__function;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  VectorXd sum_exp_z;
  MatrixXd exp_z;
  VectorXd v_max;
  assign_op<double,_double> local_81;
  void *local_80;
  long local_78;
  void *local_70;
  Index local_68;
  long local_60;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,__1,_1>_>
  local_58;
  void *local_30;
  long local_28;
  
  local_58.m_lhs.m_expression = z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_maxCoeff<double>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_30,
             (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_maxCoeff<double>,_0>_>
              *)&local_58);
  local_58.m_rhs.m_rowFactor.m_value =
       (z->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_58.m_rhs.m_matrix.m_expression.m_matrix = (NestedExpressionType)(non_const_type)&local_30;
  if ((z->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      local_28) {
    local_58.m_lhs.m_expression = z;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,_1,1>const>,Eigen::internal::assign_op<double,double>>
              (z,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
                  *)&local_58,(assign_op<double,_double> *)&local_70);
    local_58.m_lhs.m_expression = z;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_58);
    local_58.m_lhs.m_expression = (NestedExpressionType)&local_70;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_80,
               (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double>,_0>_>
                *)&local_58);
    local_58.m_rhs.m_rowFactor.m_value = local_68;
    local_58.m_rhs.m_matrix.m_expression.m_matrix = (NestedExpressionType)(non_const_type)&local_80;
    if (local_60 == local_78) {
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_data = (double *)0x0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_rows = 0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_cols = 0;
      local_58.m_lhs.m_expression = (NestedExpressionType)&local_70;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>,_1,1>const>,Eigen::internal::assign_op<double,double>>
                (__return_storage_ptr__,&local_58,&local_81);
      free(local_80);
      free(local_70);
      free(local_30);
      return __return_storage_ptr__;
    }
    __function = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, const Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, LhsType = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, RhsType = const Eigen::Replicate<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>, -1, 1>]"
    ;
    local_58.m_lhs.m_expression = (NestedExpressionType)&local_70;
  }
  else {
    __function = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, LhsType = const Eigen::Matrix<double, -1, -1>, RhsType = const Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, -1, 1>]"
    ;
    local_58.m_lhs.m_expression = z;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x6e,__function);
}

Assistant:

MatrixXd CppMLNN::softmax(MatrixXd z) {
	// minus max value of each output vector to avoid NaN
	// this is actually making softmax values to normalize between [0, 1]
	// and will not affect the results of softmax.
	VectorXd v_max = z.colwise().maxCoeff();
	z = z.rowwise() - v_max.transpose();

	MatrixXd exp_z = z.array().exp();
	VectorXd sum_exp_z = exp_z.colwise().sum();
	return static_cast<MatrixXd>(exp_z.array().rowwise() / sum_exp_z.transpose().array());
}